

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O3

ResultValue * __thiscall
FloatType::toResultValue
          (ResultValue *__return_storage_ptr__,FloatType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  int iVar1;
  long *__nptr;
  NumericChars *pNVar2;
  int *piVar3;
  undefined8 uVar4;
  size_t i;
  ulong uVar5;
  double value_00;
  string value;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  uVar5 = 0;
  do {
    pNVar2 = NumericConstant::chars(numericConstant);
    if ((ulong)((long)(pNVar2->
                      super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pNVar2->
                     super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= uVar5) {
LAB_00133d41:
      __nptr = local_58[0];
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      *piVar3 = 0;
      value_00 = strtod((char *)__nptr,(char **)&local_38);
      if (local_38 == __nptr) {
        uVar4 = std::__throw_invalid_argument("stod");
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        _Unwind_Resume(uVar4);
      }
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      else if (*piVar3 == 0x22) {
        std::__throw_out_of_range("stod");
      }
      ResultValue::ResultValue(__return_storage_ptr__,value_00);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      return __return_storage_ptr__;
    }
    pNVar2 = NumericConstant::chars(numericConstant);
    numChar = (pNVar2->super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar5];
    if (numChar < A) {
LAB_00133d10:
      NumericConstantChars::getChar(numChar);
      std::__cxx11::string::push_back((char)local_58);
    }
    else {
      if (numChar - 0x10 < 2) {
        if (uVar5 == 0) goto LAB_00133d10;
        goto LAB_00133d41;
      }
      if (numChar == DecimalPoint) goto LAB_00133d10;
      if (numChar == ImaginaryUnit) goto LAB_00133d41;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

ResultValue FloatType::toResultValue(const NumericConstant& numericConstant) const {
	std::string value = "";

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];
		bool exit = false;

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				value += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					exit = true;
				} else {
					value += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				exit = true;
				break;
			default:
				break;
		}

		if (exit) {
			break;
		}
	}

	return std::stod(value);
}